

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastReceiver.h
# Opt level: O0

void __thiscall
aeron::concurrent::broadcast::BroadcastReceiver::BroadcastReceiver
          (BroadcastReceiver *this,AtomicBuffer *buffer)

{
  index_t iVar1;
  int64_t iVar2;
  AtomicBuffer *in_RSI;
  undefined8 *in_RDI;
  index_t in_stack_000000a4;
  
  *in_RDI = in_RSI;
  iVar1 = AtomicBuffer::capacity(in_RSI);
  *(index_t *)(in_RDI + 1) = iVar1 + -0x80;
  *(int *)((long)in_RDI + 0xc) = *(int *)(in_RDI + 1) + -1;
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RDI + 1);
  *(int *)((long)in_RDI + 0x14) = *(int *)(in_RDI + 1) + 8;
  *(int *)(in_RDI + 3) = *(int *)(in_RDI + 1) + 0x10;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  std::atomic<long>::atomic((atomic<long> *)in_RSI,(__integral_type)in_RDI);
  BroadcastBufferDescriptor::checkCapacity(in_stack_000000a4);
  iVar2 = AtomicBuffer::getInt64((AtomicBuffer *)*in_RDI,*(index_t *)(in_RDI + 3));
  in_RDI[4] = iVar2;
  in_RDI[5] = in_RDI[4];
  *(uint *)((long)in_RDI + 0x1c) = (uint)in_RDI[4] & *(uint *)((long)in_RDI + 0xc);
  return;
}

Assistant:

BroadcastReceiver(AtomicBuffer& buffer) :
        m_buffer(buffer),
        m_capacity(buffer.capacity() - BroadcastBufferDescriptor::TRAILER_LENGTH),
        m_mask(m_capacity - 1),
        m_tailIntentCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_INTENT_COUNTER_OFFSET),
        m_tailCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_COUNTER_OFFSET),
        m_latestCounterIndex(m_capacity + BroadcastBufferDescriptor::LATEST_COUNTER_OFFSET),
        m_recordOffset(0),
        m_cursor(0),
        m_nextRecord(0),
        m_lappedCount(0)
    {
        BroadcastBufferDescriptor::checkCapacity(m_capacity);

        m_cursor = m_buffer.getInt64(m_latestCounterIndex);
        m_nextRecord = m_cursor;
        m_recordOffset = (std::int32_t)m_cursor & m_mask;
    }